

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O0

void knote_index_RB_INSERT_COLOR(knote_index *head,knote *elm)

{
  knote *pkVar1;
  knote *pkVar2;
  knote *pkVar3;
  knote *pkVar4;
  bool bVar5;
  knote *tmp;
  knote *gparent;
  knote *parent;
  knote *elm_local;
  knote_index *head_local;
  
  elm_local = elm;
  while( true ) {
    pkVar1 = (elm_local->kn_index).rbe_parent;
    bVar5 = false;
    if (pkVar1 != (knote *)0x0) {
      bVar5 = (pkVar1->kn_index).rbe_color == 1;
    }
    if (!bVar5) break;
    pkVar2 = (pkVar1->kn_index).rbe_parent;
    parent = pkVar1;
    if (pkVar1 == (pkVar2->kn_index).rbe_left) {
      pkVar3 = (pkVar2->kn_index).rbe_right;
      if ((pkVar3 == (knote *)0x0) || ((pkVar3->kn_index).rbe_color != 1)) {
        if ((pkVar1->kn_index).rbe_right == elm_local) {
          pkVar3 = (pkVar1->kn_index).rbe_right;
          pkVar4 = (pkVar3->kn_index).rbe_left;
          (pkVar1->kn_index).rbe_right = pkVar4;
          if (pkVar4 != (knote *)0x0) {
            (((pkVar3->kn_index).rbe_left)->kn_index).rbe_parent = pkVar1;
          }
          pkVar4 = (pkVar1->kn_index).rbe_parent;
          (pkVar3->kn_index).rbe_parent = pkVar4;
          if (pkVar4 == (knote *)0x0) {
            head->rbh_root = pkVar3;
          }
          else if (pkVar1 == (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_left) {
            (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_left = pkVar3;
          }
          else {
            (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_right = pkVar3;
          }
          (pkVar3->kn_index).rbe_left = pkVar1;
          (pkVar1->kn_index).rbe_parent = pkVar3;
          parent = elm_local;
          elm_local = pkVar1;
        }
        (parent->kn_index).rbe_color = 0;
        (pkVar2->kn_index).rbe_color = 1;
        pkVar1 = (pkVar2->kn_index).rbe_left;
        pkVar3 = (pkVar1->kn_index).rbe_right;
        (pkVar2->kn_index).rbe_left = pkVar3;
        if (pkVar3 != (knote *)0x0) {
          (((pkVar1->kn_index).rbe_right)->kn_index).rbe_parent = pkVar2;
        }
        pkVar3 = (pkVar2->kn_index).rbe_parent;
        (pkVar1->kn_index).rbe_parent = pkVar3;
        if (pkVar3 == (knote *)0x0) {
          head->rbh_root = pkVar1;
        }
        else if (pkVar2 == (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_left) {
          (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_left = pkVar1;
        }
        else {
          (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_right = pkVar1;
        }
        (pkVar1->kn_index).rbe_right = pkVar2;
        (pkVar2->kn_index).rbe_parent = pkVar1;
      }
      else {
        (pkVar3->kn_index).rbe_color = 0;
        (pkVar1->kn_index).rbe_color = 0;
        (pkVar2->kn_index).rbe_color = 1;
        elm_local = pkVar2;
      }
    }
    else {
      pkVar3 = (pkVar2->kn_index).rbe_left;
      if ((pkVar3 == (knote *)0x0) || ((pkVar3->kn_index).rbe_color != 1)) {
        if ((pkVar1->kn_index).rbe_left == elm_local) {
          pkVar3 = (pkVar1->kn_index).rbe_left;
          pkVar4 = (pkVar3->kn_index).rbe_right;
          (pkVar1->kn_index).rbe_left = pkVar4;
          if (pkVar4 != (knote *)0x0) {
            (((pkVar3->kn_index).rbe_right)->kn_index).rbe_parent = pkVar1;
          }
          pkVar4 = (pkVar1->kn_index).rbe_parent;
          (pkVar3->kn_index).rbe_parent = pkVar4;
          if (pkVar4 == (knote *)0x0) {
            head->rbh_root = pkVar3;
          }
          else if (pkVar1 == (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_left) {
            (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_left = pkVar3;
          }
          else {
            (((pkVar1->kn_index).rbe_parent)->kn_index).rbe_right = pkVar3;
          }
          (pkVar3->kn_index).rbe_right = pkVar1;
          (pkVar1->kn_index).rbe_parent = pkVar3;
          parent = elm_local;
          elm_local = pkVar1;
        }
        (parent->kn_index).rbe_color = 0;
        (pkVar2->kn_index).rbe_color = 1;
        pkVar1 = (pkVar2->kn_index).rbe_right;
        pkVar3 = (pkVar1->kn_index).rbe_left;
        (pkVar2->kn_index).rbe_right = pkVar3;
        if (pkVar3 != (knote *)0x0) {
          (((pkVar1->kn_index).rbe_left)->kn_index).rbe_parent = pkVar2;
        }
        pkVar3 = (pkVar2->kn_index).rbe_parent;
        (pkVar1->kn_index).rbe_parent = pkVar3;
        if (pkVar3 == (knote *)0x0) {
          head->rbh_root = pkVar1;
        }
        else if (pkVar2 == (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_left) {
          (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_left = pkVar1;
        }
        else {
          (((pkVar2->kn_index).rbe_parent)->kn_index).rbe_right = pkVar1;
        }
        (pkVar1->kn_index).rbe_left = pkVar2;
        (pkVar2->kn_index).rbe_parent = pkVar1;
      }
      else {
        (pkVar3->kn_index).rbe_color = 0;
        (pkVar1->kn_index).rbe_color = 0;
        (pkVar2->kn_index).rbe_color = 1;
        elm_local = pkVar2;
      }
    }
  }
  (head->rbh_root->kn_index).rbe_color = 0;
  return;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}